

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *
qSelectionPersistentRowLengths(QItemSelection *sel)

{
  bool bVar1;
  const_iterator o;
  QItemSelectionRange *in_RDI;
  long in_FS_OFFSET;
  QItemSelectionRange *range;
  QItemSelection *__range1;
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *result;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QItemSelectionRange> *in_stack_ffffffffffffff90;
  QItemSelectionRange *range_00;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->tl)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->br).d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  range_00 = in_RDI;
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::QList
            ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x82a9f3);
  local_10.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QItemSelectionRange>::begin(in_stack_ffffffffffffff90);
  o = QList<QItemSelectionRange>::end(in_stack_ffffffffffffff90);
  while (bVar1 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_10,o), bVar1) {
    QList<QItemSelectionRange>::const_iterator::operator*(&local_10);
    rowLengthsFromRange(range_00,(QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)in_RDI);
    QList<QItemSelectionRange>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)range_00;
}

Assistant:

static QList<std::pair<QPersistentModelIndex, uint>> qSelectionPersistentRowLengths(const QItemSelection &sel)
{
    QList<std::pair<QPersistentModelIndex, uint>> result;
    for (const QItemSelectionRange &range : sel)
        rowLengthsFromRange(range, result);
    return result;
}